

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_bindec(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  char *zSrc;
  char **in_RCX;
  anon_union_8_3_18420de5_for_x aVar2;
  jx9_int64 iVal;
  int nLen;
  anon_union_8_3_18420de5_for_x local_28;
  sxu32 local_1c;
  
  if (nArg < 1) {
    aVar2.iVal = -1;
  }
  else {
    local_28.rVal = 0.0;
    pjVar1 = *apArg;
    if ((pjVar1->iFlags & 1) == 0) {
      jx9MemObjToInteger(pjVar1);
      local_28 = pjVar1->x;
      aVar2 = local_28;
    }
    else {
      zSrc = jx9_value_to_string(pjVar1,(int *)&local_1c);
      aVar2 = local_28;
      if (0 < (int)local_1c) {
        SyBinaryStrToInt64(zSrc,local_1c,&local_28,in_RCX);
        aVar2 = local_28;
      }
    }
  }
  pjVar1 = pCtx->pRet;
  jx9MemObjRelease(pjVar1);
  (pjVar1->x).iVal = (sxi64)aVar2;
  pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_bindec(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	jx9_int64 iVal;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	iVal = 0;
	if( jx9_value_is_string(apArg[0]) ){
		/* Extract the given string */
		zString = jx9_value_to_string(apArg[0], &nLen);
		if( nLen > 0 ){
			/* Perform a binary cast */
			SyBinaryStrToInt64(zString, (sxu32)nLen, (void *)&iVal, 0);
		}
	}else{
		/* Extract as a 64-bit integer */
		iVal = jx9_value_to_int64(apArg[0]);
	}
	/* Return the number */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}